

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O1

void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **ppFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Fxu_Double *pFVar5;
  uint uVar6;
  int iVar7;
  Fxu_Double **ppFVar8;
  Fxu_Double **ppFVar9;
  Fxu_Double *pFVar10;
  
  uVar6 = pDiv->HNum;
  if (((int)uVar6 < 1) || (p->nItemsAlloc < (int)uVar6)) {
    __assert_fail("(pDiv)->HNum >= 1 && (pDiv)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                  ,0xe3,"void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *, Fxu_Double *)");
  }
  if ((uVar6 != 1) && (p->pTree[uVar6 >> 1]->Weight < pDiv->Weight)) {
    pFVar5 = p->pTree[pDiv->HNum];
    if (1 < pFVar5->HNum) {
      iVar3 = pFVar5->Weight;
      ppFVar8 = p->pTree + pDiv->HNum;
      uVar6 = pFVar5->HNum;
      do {
        pFVar10 = p->pTree[uVar6 >> 1];
        if (iVar3 <= pFVar10->Weight) {
          return;
        }
        ppFVar9 = p->pTree + (uVar6 >> 1);
        *ppFVar8 = pFVar10;
        *ppFVar9 = pFVar5;
        uVar2 = (*ppFVar8)->HNum;
        (*ppFVar8)->HNum = uVar6;
        pFVar5->HNum = uVar2;
        ppFVar8 = ppFVar9;
        uVar6 = uVar2;
      } while (1 < (int)uVar2);
    }
    return;
  }
  uVar6 = uVar6 * 2;
  if (((p->nItems < (int)uVar6) || (p->pTree[(int)uVar6]->Weight <= pDiv->Weight)) &&
     ((p->nItems <= (int)uVar6 || (p->pTree[(int)(uVar6 | 1)]->Weight <= pDiv->Weight)))) {
    return;
  }
  iVar3 = p->nItems;
  pFVar5 = p->pTree[pDiv->HNum];
  uVar6 = pFVar5->HNum * 2;
  if ((int)uVar6 <= iVar3) {
    ppFVar8 = p->pTree + pDiv->HNum;
    iVar7 = pFVar5->HNum;
    do {
      ppFVar9 = p->pTree + (int)uVar6;
      if ((int)uVar6 < iVar3) {
        ppFVar1 = p->pTree + (int)(uVar6 | 1);
        iVar4 = (*ppFVar9)->Weight;
        if ((iVar4 <= pFVar5->Weight) && ((*ppFVar1)->Weight <= pFVar5->Weight)) {
          return;
        }
        pFVar10 = *ppFVar9;
        if (iVar4 < (*ppFVar1)->Weight) {
          ppFVar9 = ppFVar1;
          pFVar10 = *ppFVar1;
        }
      }
      else {
        pFVar10 = *ppFVar9;
        if ((*ppFVar9)->Weight <= pFVar5->Weight) {
          return;
        }
      }
      *ppFVar8 = pFVar10;
      *ppFVar9 = pFVar5;
      iVar4 = (*ppFVar8)->HNum;
      (*ppFVar8)->HNum = iVar7;
      pFVar5->HNum = iVar4;
      uVar6 = iVar4 * 2;
      ppFVar8 = ppFVar9;
      iVar7 = iVar4;
    } while ((int)uVar6 <= iVar3);
  }
  return;
}

Assistant:

void Fxu_HeapDoubleUpdate( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
//printf( "Updating divisor %d.\n", pDiv->Num );

    FXU_HEAP_DOUBLE_ASSERT(p,pDiv);
    if ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,pDiv) && 
         FXU_HEAP_DOUBLE_WEIGHT(pDiv) > FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_PARENT(p,pDiv) ) )
        Fxu_HeapDoubleMoveUp( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD1(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD2(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
}